

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Tag.cpp
# Opt level: O1

TagDeclarationCategory __thiscall psy::C::TagDeclarationSymbol::category(TagDeclarationSymbol *this)

{
  SymbolKind SVar1;
  TagDeclarationCategory TVar2;
  ostream *poVar3;
  
  SVar1 = Symbol::kind((Symbol *)this);
  if ((byte)(SVar1 - StructDeclaration) < 3) {
    TVar2 = (TagDeclarationCategory)(0x10000 >> ((SVar1 - StructDeclaration & 3) << 3));
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"[ASSERT] at ",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/symbols/TypeDeclaration_Tag.cpp"
               ,0x65);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x43);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<empty message>",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    TVar2 = ~StructOrUnion;
  }
  return TVar2;
}

Assistant:

TagDeclarationCategory TagDeclarationSymbol::category() const
{
    switch (kind()) {
        case SymbolKind::Program:
        case SymbolKind::TranslationUnit:
        case SymbolKind::FunctionDeclaration:
        case SymbolKind::EnumeratorDeclaration:
        case SymbolKind::FieldDeclaration:
        case SymbolKind::VariableDeclaration:
        case SymbolKind::ParameterDeclaration:
        case SymbolKind::TypedefDeclaration:
            break;
        case SymbolKind::StructDeclaration:
        case SymbolKind::UnionDeclaration:
            return TagDeclarationCategory::StructOrUnion;
        case SymbolKind::EnumDeclaration:
            return TagDeclarationCategory::Enum;
    }
    PSY_ASSERT_1(false);
    return TagDeclarationCategory(~0);
}